

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O3

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::BufferSupport::BufferSupport
          (BufferSupport *this,ResourceDescription *resourceDesc,BufferType bufferType,
          AccessMode mode,VkShaderStageFlagBits stage,DispatchCall dispatchCall)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VkFormat VVar2;
  int i;
  long lVar3;
  long *plVar4;
  size_type *psVar5;
  char *pcVar6;
  long *local_40 [2];
  long local_30 [2];
  
  (this->super_OperationSupport)._vptr_OperationSupport = (_func_int **)&PTR__BufferSupport_00d02020
  ;
  (this->m_resourceDesc).type = resourceDesc->type;
  lVar3 = 0;
  do {
    (this->m_resourceDesc).size.m_data[lVar3] = (resourceDesc->size).m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  (this->m_resourceDesc).imageAspect = resourceDesc->imageAspect;
  VVar2 = resourceDesc->imageFormat;
  (this->m_resourceDesc).imageType = resourceDesc->imageType;
  (this->m_resourceDesc).imageFormat = VVar2;
  this->m_bufferType = bufferType;
  this->m_mode = mode;
  this->m_stage = stage;
  pcVar6 = "write_";
  if (mode == ACCESS_MODE_READ) {
    pcVar6 = "read_";
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,pcVar6,pcVar6 + (6 - (ulong)(mode == ACCESS_MODE_READ)));
  plVar4 = (long *)std::__cxx11::string::append((char *)local_40);
  paVar1 = &(this->m_shaderPrefix).field_2;
  (this->m_shaderPrefix)._M_dataplus._M_p = (pointer)paVar1;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar3 = plVar4[3];
    paVar1->_M_allocated_capacity = *psVar5;
    *(long *)((long)&(this->m_shaderPrefix).field_2 + 8) = lVar3;
  }
  else {
    (this->m_shaderPrefix)._M_dataplus._M_p = (pointer)*plVar4;
    (this->m_shaderPrefix).field_2._M_allocated_capacity = *psVar5;
  }
  (this->m_shaderPrefix)._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  this->m_dispatchCall = dispatchCall;
  return;
}

Assistant:

BufferSupport (const ResourceDescription&	resourceDesc,
				   const BufferType				bufferType,
				   const AccessMode				mode,
				   const VkShaderStageFlagBits	stage,
				   const DispatchCall			dispatchCall = DISPATCH_CALL_DISPATCH)
		: m_resourceDesc	(resourceDesc)
		, m_bufferType		(bufferType)
		, m_mode			(mode)
		, m_stage			(stage)
		, m_shaderPrefix	(std::string(m_mode == ACCESS_MODE_READ ? "read_" : "write_") + (m_bufferType == BUFFER_TYPE_UNIFORM ? "ubo_" : "ssbo_"))
		, m_dispatchCall	(dispatchCall)
	{
		DE_ASSERT(m_resourceDesc.type == RESOURCE_TYPE_BUFFER);
		DE_ASSERT(m_bufferType == BUFFER_TYPE_UNIFORM || m_bufferType == BUFFER_TYPE_STORAGE);
		DE_ASSERT(m_mode == ACCESS_MODE_READ || m_mode == ACCESS_MODE_WRITE);
		DE_ASSERT(m_mode == ACCESS_MODE_READ || m_bufferType == BUFFER_TYPE_STORAGE);
		DE_ASSERT(m_bufferType != BUFFER_TYPE_UNIFORM || m_resourceDesc.size.x() <= MAX_UBO_RANGE);
		DE_ASSERT(m_dispatchCall == DISPATCH_CALL_DISPATCH || m_dispatchCall == DISPATCH_CALL_DISPATCH_INDIRECT);

		assertValidShaderStage(m_stage);
	}